

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

void Rml::Parse::Ternary(DataParser *parser)

{
  size_t sVar1;
  size_t sVar2;
  size_t local_100;
  InstructionData local_f8;
  size_t local_c8;
  InstructionData local_c0;
  size_t local_90;
  size_t end;
  size_t false_branch;
  size_t local_58;
  size_t jump_end;
  Variant local_40;
  size_t local_18;
  size_t jump_false_branch;
  DataParser *parser_local;
  
  jump_false_branch = (size_t)parser;
  local_18 = DataParser::InstructionIndex(parser);
  sVar1 = jump_false_branch;
  Variant::Variant(&local_40);
  DataParser::Emit((DataParser *)sVar1,JumpIfZero,&local_40);
  Variant::~Variant(&local_40);
  DataParser::Match((DataParser *)jump_false_branch,'?',true);
  Expression((DataParser *)jump_false_branch);
  local_58 = DataParser::InstructionIndex((DataParser *)jump_false_branch);
  sVar1 = jump_false_branch;
  Variant::Variant((Variant *)&false_branch);
  DataParser::Emit((DataParser *)sVar1,Jump,(Variant *)&false_branch);
  Variant::~Variant((Variant *)&false_branch);
  DataParser::Match((DataParser *)jump_false_branch,':',true);
  end = DataParser::InstructionIndex((DataParser *)jump_false_branch);
  Expression((DataParser *)jump_false_branch);
  local_90 = DataParser::InstructionIndex((DataParser *)jump_false_branch);
  sVar2 = jump_false_branch;
  sVar1 = local_18;
  local_c0.instruction = JumpIfZero;
  local_c8 = end;
  Variant::Variant<unsigned_long,void>(&local_c0.data,&local_c8);
  DataParser::PatchInstruction((DataParser *)sVar2,sVar1,&local_c0);
  InstructionData::~InstructionData(&local_c0);
  sVar2 = jump_false_branch;
  sVar1 = local_58;
  local_f8.instruction = Jump;
  local_100 = local_90;
  Variant::Variant<unsigned_long,void>(&local_f8.data,&local_100);
  DataParser::PatchInstruction((DataParser *)sVar2,sVar1,&local_f8);
  InstructionData::~InstructionData(&local_f8);
  return;
}

Assistant:

static void Ternary(DataParser& parser)
	{
		size_t jump_false_branch = parser.InstructionIndex();
		parser.Emit(Instruction::JumpIfZero);

		parser.Match('?');
		Expression(parser);
		size_t jump_end = parser.InstructionIndex();
		parser.Emit(Instruction::Jump);

		parser.Match(':');
		size_t false_branch = parser.InstructionIndex();
		Expression(parser);

		size_t end = parser.InstructionIndex();
		parser.PatchInstruction(jump_false_branch, InstructionData{Instruction::JumpIfZero, Variant((uint64_t)false_branch)});
		parser.PatchInstruction(jump_end, InstructionData{Instruction::Jump, Variant((uint64_t)end)});
	}